

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

float __thiscall nv::FloatImage::sampleNearestClamp(FloatImage *this,float x,float y,int c)

{
  uint *puVar1;
  float fVar2;
  int local_3c [3];
  uint local_30;
  int local_2c;
  int iy;
  int local_24;
  uint local_20;
  uint local_1c;
  int ix;
  int c_local;
  float y_local;
  float x_local;
  FloatImage *this_local;
  
  local_1c = c;
  ix = (int)y;
  c_local = (int)x;
  _y_local = this;
  local_24 = anon_unknown.dwarf_46676e::iround(x * (float)this->m_width);
  iy = 0;
  local_2c = this->m_width - 1;
  puVar1 = (uint *)clamp<int>(&local_24,&iy,&local_2c);
  local_20 = *puVar1;
  local_3c[2] = anon_unknown.dwarf_46676e::iround((float)ix * (float)this->m_height);
  local_3c[1] = 0;
  local_3c[0] = this->m_height - 1;
  puVar1 = (uint *)clamp<int>(local_3c + 2,local_3c + 1,local_3c);
  local_30 = *puVar1;
  fVar2 = pixel(this,local_20,local_30,local_1c);
  return fVar2;
}

Assistant:

float FloatImage::sampleNearestClamp(const float x, const float y, const int c) const
{
	int ix = ::clamp(iround(x * m_width), 0, m_width-1);
	int iy = ::clamp(iround(y * m_height), 0, m_height-1);
	return pixel(ix, iy, c);
}